

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests2.cpp
# Opt level: O0

void __thiscall
iu_TypeConversionParamTest_x_iutest_x_Test_Test::iu_TypeConversionParamTest_x_iutest_x_Test_Test
          (iu_TypeConversionParamTest_x_iutest_x_Test_Test *this)

{
  iu_TypeConversionParamTest_x_iutest_x_Test_Test *this_local;
  
  TypeConversionParamTest::TypeConversionParamTest(&this->super_type);
  (this->super_type).super_TestWithParam<double>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_TypeConversionParamTest_x_iutest_x_Test_Test_006168c8;
  (this->super_type).super_TestWithParam<double>.super_WithParamInterface<double>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__iu_TypeConversionParamTest_x_iutest_x_Test_Test_00616908;
  return;
}

Assistant:

IUTEST_P(TypeConversionParamTest, Test)
{
}